

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O1

void __thiscall
QHttp2ProtocolHandler::handleDataReceived
          (QHttp2ProtocolHandler *this,QByteArray *data,bool endStream)

{
  qint64 *pqVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  ContextType *object;
  QHttpNetworkRequestPrivate *pQVar5;
  QHttpNetworkReplyPrivate *this_00;
  QHttp2Stream *pQVar6;
  bool bVar7;
  long lVar8;
  QSharedDataPointer<QHttpNetworkRequestPrivate> *this_01;
  long in_FS_OFFSET;
  QHttp2Stream *stream;
  code *local_68;
  undefined8 local_60;
  QHttp2Stream *local_58;
  QMetaMethodReturnArgument local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::sender();
  local_58 = (QHttp2Stream *)QMetaObject::cast((QObject *)&QHttp2Stream::staticMetaObject);
  QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
  tryEmplace_impl<QHttp2Stream*const&>
            ((TryEmplaceResult *)&local_50,
             (QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)(this + 0x50)
             ,&local_58);
  if ((data->d).size != 0) {
    lVar8 = ((ulong)local_50.name >> 7) * 0x90;
    lVar4 = *(long *)((local_50.metaType)->defaultCtr + lVar8 + 0x80);
    bVar3 = (byte)(local_50.metaType)->defaultCtr[(ulong)((uint)local_50.name & 0x7f) + lVar8];
    object = *(ContextType **)(lVar4 + 0x18 + (ulong)bVar3 * 0x20);
    this_01 = (QSharedDataPointer<QHttpNetworkRequestPrivate> *)(lVar4 + (ulong)bVar3 * 0x20 + 0x10)
    ;
    pQVar5 = (this_01->d).ptr;
    if ((pQVar5 != (QHttpNetworkRequestPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar5->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1)) {
      QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(this_01);
    }
    if (((this_01->d).ptr)->needResendWithCredentials == false) {
      this_00 = *(QHttpNetworkReplyPrivate **)&object->field_0x8;
      local_50.data = (void *)(data->d).size;
      this_00->totalProgress = this_00->totalProgress + (long)local_50.data;
      local_50.metaType = (QMetaTypeInterface *)(data->d).d;
      local_50.name = (data->d).ptr;
      if (local_50.metaType != (QMetaTypeInterface *)0x0) {
        LOCK();
        *(int *)local_50.metaType = *(int *)local_50.metaType + 1;
        UNLOCK();
      }
      if (local_50.data != (void *)0x0) {
        pqVar1 = &(this_00->responseData).bufferCompleteSize;
        *pqVar1 = *pqVar1 + (long)local_50.data;
        QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                  ((QMovableArrayOps<QByteArray> *)&this_00->responseData,
                   (this_00->responseData).buffers.d.size,(QByteArray *)&local_50);
        QList<QByteArray>::end(&(this_00->responseData).buffers);
      }
      if (local_50.metaType != (QMetaTypeInterface *)0x0) {
        LOCK();
        *(int *)local_50.metaType = *(int *)local_50.metaType + -1;
        iVar2._0_2_ = (local_50.metaType)->revision;
        iVar2._2_2_ = (local_50.metaType)->alignment;
        UNLOCK();
        if (iVar2 == 0) {
          QArrayData::deallocate((QArrayData *)local_50.metaType,1,0x10);
        }
      }
      bVar7 = QHttpNetworkReplyPrivate::shouldEmitSignals(this_00);
      if (bVar7) {
        local_68 = QHttpNetworkReply::readyRead;
        local_60 = 0;
        local_50.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
        local_50.name = (char *)0x0;
        local_50.data = (void *)0x0;
        QMetaObject::invokeMethodCallableHelper<void(QHttpNetworkReply::*)()>
                  (object,(offset_in_QHttpNetworkReply_to_subr *)&local_68,QueuedConnection,
                   &local_50);
        local_68 = QHttpNetworkReply::dataReadProgress;
        local_60 = 0;
        local_50.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
        local_50.name = (char *)0x0;
        local_50.data = (void *)0x0;
        QMetaObject::
        invokeMethodCallableHelper<void(QHttpNetworkReply::*)(long_long,long_long),long_long&,long_long&>
                  (object,(offset_in_QHttpNetworkReply_to_subr *)&local_68,QueuedConnection,
                   &local_50,&this_00->totalProgress,&this_00->bodyLength);
      }
    }
  }
  pQVar6 = local_58;
  QList<QByteArray>::clear(&(local_58->m_downloadBuffer).buffers);
  (pQVar6->m_downloadBuffer).bufferCompleteSize = 0;
  (pQVar6->m_downloadBuffer).firstPos = 0;
  if (endStream) {
    finishStream(this,local_58,QueuedConnection);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::handleDataReceived(const QByteArray &data, bool endStream)
{
    QHttp2Stream *stream = qobject_cast<QHttp2Stream *>(sender());
    auto &httpPair = requestReplyPairs[stream];
    auto *httpReply = httpPair.second;
    Q_ASSERT(!stream->isPromisedStream());

    if (!data.isEmpty() && !httpPair.first.d->needResendWithCredentials) {
        auto *replyPrivate = httpReply->d_func();

        replyPrivate->totalProgress += data.size();

        replyPrivate->responseData.append(data);

        if (replyPrivate->shouldEmitSignals()) {
            QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::readyRead,
                                      Qt::QueuedConnection);
            QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::dataReadProgress,
                                      Qt::QueuedConnection, replyPrivate->totalProgress,
                                      replyPrivate->bodyLength);
        }
    }
    stream->clearDownloadBuffer();
    if (endStream)
        finishStream(stream, Qt::QueuedConnection);
}